

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyReadCellIsFlop(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  int iVar1;
  Scl_Item_t *local_28;
  Scl_Item_t *pAttr;
  Scl_Item_t *pCell_local;
  Scl_Tree_t *p_local;
  
  local_28 = Scl_LibertyItem(p,pCell->Child);
  while( true ) {
    if (local_28 == (Scl_Item_t *)0x0) {
      return 0;
    }
    iVar1 = Scl_LibertyCompare(p,local_28->Key,"ff");
    if ((iVar1 == 0) || (iVar1 = Scl_LibertyCompare(p,local_28->Key,"latch"), iVar1 == 0)) break;
    local_28 = Scl_LibertyItem(p,local_28->Next);
  }
  return 1;
}

Assistant:

int Scl_LibertyReadCellIsFlop( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pAttr;
    Scl_ItemForEachChild( p, pCell, pAttr )
        if ( !Scl_LibertyCompare(p, pAttr->Key, "ff") ||
             !Scl_LibertyCompare(p, pAttr->Key, "latch") )
            return 1;
    return 0;
}